

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O2

void __thiscall libtorrent::dht::find_data::done(find_data *this)

{
  uint uVar1;
  dht_observer *pdVar2;
  pointer psVar3;
  element_type *peVar4;
  observer *this_00;
  int iVar5;
  node *pnVar6;
  iterator iVar7;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  int iVar8;
  pointer psVar9;
  endpoint local_b4;
  _Base_ptr local_98;
  map<libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_90;
  node_entry local_88;
  vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  results;
  
  this->m_done = true;
  pnVar6 = (this->super_traversal_algorithm).m_node;
  pdVar2 = pnVar6->m_observer;
  if (pdVar2 != (dht_observer *)0x0) {
    uVar1 = (this->super_traversal_algorithm).m_id;
    (*(this->super_traversal_algorithm)._vptr_traversal_algorithm[2])(this);
    (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])(pdVar2,4,"[%u] %s DONE",(ulong)uVar1);
    pnVar6 = (this->super_traversal_algorithm).m_node;
  }
  results.
  super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar8 = (pnVar6->m_table).m_bucket_size;
  psVar9 = (this->super_traversal_algorithm).m_results.
           super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->super_traversal_algorithm).m_results.
           super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = &this->m_write_tokens;
  local_98 = &(this->m_write_tokens)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if ((psVar9 == psVar3) || (iVar8 < 1)) {
      if ((this->m_nodes_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        ::std::
        function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
        ::operator()(&this->m_nodes_callback,&results);
      }
      traversal_algorithm::done(&this->super_traversal_algorithm);
      ::std::
      vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&results);
      return;
    }
    peVar4 = (psVar9->super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (((peVar4->flags).m_val & 0x40) == 0) {
      if ((pdVar2 != (dht_observer *)0x0) &&
         (iVar5 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,4), (char)iVar5 != '\0')) {
        uVar1 = (this->super_traversal_algorithm).m_id;
        observer::target_ep(&local_b4,
                            (psVar9->
                            super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr);
        aux::print_endpoint_abi_cxx11_((string *)&local_88,(aux *)&local_b4,ep);
        (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
                  (pdVar2,4,"[%u] not alive: %s",(ulong)uVar1);
LAB_003598d9:
        ::std::__cxx11::string::~string((string *)&local_88);
      }
    }
    else {
      iVar7 = ::std::
              _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_90->_M_t,&peVar4->m_id);
      if (iVar7._M_node == local_98) {
        if ((pdVar2 != (dht_observer *)0x0) &&
           (iVar5 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,4), (char)iVar5 != '\0'))
        {
          uVar1 = (this->super_traversal_algorithm).m_id;
          observer::target_ep(&local_b4,
                              (psVar9->
                              super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
          aux::print_endpoint_abi_cxx11_((string *)&local_88,(aux *)&local_b4,ep_01);
          (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
                    (pdVar2,4,"[%u] no write token: %s",(ulong)uVar1);
          goto LAB_003598d9;
        }
      }
      else {
        this_00 = (psVar9->super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        observer::target_ep(&local_b4,this_00);
        node_entry::node_entry(&local_88,&this_00->m_id,&local_b4,0xffff,false);
        ::std::
        vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>
        ::emplace_back<libtorrent::dht::node_entry,std::__cxx11::string&>
                  ((vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>
                    *)&results,&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &iVar7._M_node[1]._M_right);
        if ((pdVar2 != (dht_observer *)0x0) &&
           (iVar5 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,4), (char)iVar5 != '\0'))
        {
          uVar1 = (this->super_traversal_algorithm).m_id;
          observer::target_ep(&local_b4,
                              (psVar9->
                              super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
          aux::print_endpoint_abi_cxx11_((string *)&local_88,(aux *)&local_b4,ep_00);
          (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])(pdVar2,4,"[%u] %s",(ulong)uVar1);
          ::std::__cxx11::string::~string((string *)&local_88);
        }
        iVar8 = iVar8 + -1;
      }
    }
    psVar9 = psVar9 + 1;
  } while( true );
}

Assistant:

void find_data::done()
{
	m_done = true;

#ifndef TORRENT_DISABLE_LOGGING
	auto* logger = get_node().observer();
	if (logger != nullptr)
	{
		logger->log(dht_logger::traversal, "[%u] %s DONE"
			, id(), name());
	}
#endif

	std::vector<std::pair<node_entry, std::string>> results;
	int num_results = m_node.m_table.bucket_size();
	for (auto i = m_results.begin()
		, end(m_results.end()); i != end && num_results > 0; ++i)
	{
		observer_ptr const& o = *i;
		if (!(o->flags & observer::flag_alive))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (logger != nullptr && logger->should_log(dht_logger::traversal))
			{
				logger->log(dht_logger::traversal, "[%u] not alive: %s"
					, id(), aux::print_endpoint(o->target_ep()).c_str());
			}
#endif
			continue;
		}
		auto j = m_write_tokens.find(o->id());
		if (j == m_write_tokens.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (logger != nullptr && logger->should_log(dht_logger::traversal))
			{
				logger->log(dht_logger::traversal, "[%u] no write token: %s"
					, id(), aux::print_endpoint(o->target_ep()).c_str());
			}
#endif
			continue;
		}
		results.emplace_back(node_entry(o->id(), o->target_ep()), j->second);
#ifndef TORRENT_DISABLE_LOGGING
		if (logger != nullptr && logger->should_log(dht_logger::traversal))
		{
			logger->log(dht_logger::traversal, "[%u] %s"
				, id(), aux::print_endpoint(o->target_ep()).c_str());
		}
#endif
		--num_results;
	}

	if (m_nodes_callback) m_nodes_callback(results);

	traversal_algorithm::done();
}